

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.hh
# Opt level: O2

void __thiscall
tinyusdz::ascii::AsciiParser::VariableDef::VariableDef
          (VariableDef *this,string *t,string *n,bool a,PostParseHandler *ph)

{
  ::std::__cxx11::string::string((string *)this,(string *)t);
  ::std::__cxx11::string::string((string *)&this->name,(string *)n);
  this->allow_array_type = a;
  ::std::
  function<nonstd::expected_lite::expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function(&this->post_parse_handler,ph);
  return;
}

Assistant:

VariableDef(const std::string &t, const std::string &n, bool a = false,
                PostParseHandler ph = DefaultPostParseHandler)
        : type(t), name(n), allow_array_type(a), post_parse_handler(ph) {}